

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O0

void __thiscall
TPZTensor<double>::ComputeEigenvectors(TPZTensor<double> *this,TPZDecomposed *eigensystem)

{
  bool bVar1;
  TPZManVector<double,_3> *rval;
  TPZTensor<double> *this_00;
  TPZManVector<double,_3> *pTVar2;
  double *pdVar3;
  int *in_RSI;
  TPZDecomposed *in_RDI;
  __type_conflict _Var4;
  TPZDecomposed *pTVar5;
  size_t in_stack_00000018;
  char *in_stack_00000020;
  uint i_2;
  uint i_1;
  REAL Norm;
  uint lambda;
  TPZTensor<double> A;
  TPZDecomposed eigensystemTemp;
  REAL conditionFactor;
  uint j;
  uint i;
  double tol;
  undefined4 in_stack_fffffffffffffbf8;
  int in_stack_fffffffffffffbfc;
  TPZDecomposed *in_stack_fffffffffffffc00;
  TPZTensor<double> *in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc10;
  int iVar6;
  TPZManVector<double,_3> *in_stack_fffffffffffffc18;
  TPZManVector<double,_3> *in_stack_fffffffffffffc20;
  int64_t in_stack_fffffffffffffc28;
  uint local_3c8;
  uint local_3c4;
  double local_3c0;
  uint local_3b4;
  TPZDecomposed *in_stack_fffffffffffffc58;
  TPZTensor<double> *in_stack_fffffffffffffc60;
  TPZDecomposed *in_stack_fffffffffffffc78;
  TPZTensor<double> *in_stack_fffffffffffffc80;
  REAL *in_stack_fffffffffffffc88;
  TPZTensor<double> *in_stack_fffffffffffffc90;
  TPZManVector<TPZManVector<double,_3>,_3> *in_stack_fffffffffffffcb8;
  TPZManVector<TPZManVector<double,_3>,_3> *in_stack_fffffffffffffcc0;
  uint local_f0;
  uint local_ec;
  bool in_stack_ffffffffffffffc7;
  TPZDecomposed *in_stack_ffffffffffffffc8;
  TPZTensor<double> *in_stack_ffffffffffffffd0;
  
  if (*in_RSI == 0) {
    ComputeEigenvalues(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc7
                      );
  }
  else {
    TPZManVector<double,_3>::TPZManVector
              ((TPZManVector<double,_3> *)in_RDI,in_stack_fffffffffffffc28,
               (double *)in_stack_fffffffffffffc20);
    pTVar5 = (TPZDecomposed *)
             TPZVec<TPZManVector<double,_3>_>::operator[]
                       ((TPZVec<TPZManVector<double,_3>_> *)(in_RSI + 0x1c),0);
    TPZManVector<double,_3>::operator=(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
    TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffffc00);
    TPZManVector<double,_3>::TPZManVector
              ((TPZManVector<double,_3> *)in_RDI,(int64_t)pTVar5,(double *)in_stack_fffffffffffffc20
              );
    pTVar2 = TPZVec<TPZManVector<double,_3>_>::operator[]
                       ((TPZVec<TPZManVector<double,_3>_> *)(in_RSI + 0x1c),1);
    TPZManVector<double,_3>::operator=(pTVar2,in_stack_fffffffffffffc18);
    TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffffc00);
    TPZManVector<double,_3>::TPZManVector
              ((TPZManVector<double,_3> *)in_RDI,(int64_t)pTVar5,(double *)pTVar2);
    rval = TPZVec<TPZManVector<double,_3>_>::operator[]
                     ((TPZVec<TPZManVector<double,_3>_> *)(in_RSI + 0x1c),2);
    TPZManVector<double,_3>::operator=(pTVar2,rval);
    TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffffc00);
    iVar6 = *in_RSI;
    if (iVar6 == 1) {
      pTVar2 = TPZVec<TPZManVector<double,_3>_>::operator[]
                         ((TPZVec<TPZManVector<double,_3>_> *)(in_RSI + 0x1c),0);
      pdVar3 = TPZVec<double>::operator[](&pTVar2->super_TPZVec<double>,0);
      *pdVar3 = 1.0;
      pTVar2 = TPZVec<TPZManVector<double,_3>_>::operator[]
                         ((TPZVec<TPZManVector<double,_3>_> *)(in_RSI + 0x1c),1);
      pdVar3 = TPZVec<double>::operator[](&pTVar2->super_TPZVec<double>,1);
      *pdVar3 = 1.0;
      pTVar2 = TPZVec<TPZManVector<double,_3>_>::operator[]
                         ((TPZVec<TPZManVector<double,_3>_> *)(in_RSI + 0x1c),2);
      pdVar3 = TPZVec<double>::operator[](&pTVar2->super_TPZVec<double>,2);
      *pdVar3 = 1.0;
      return;
    }
    if (iVar6 - 2U < 2) {
      TPZTensor<double>::Norm((TPZTensor<double> *)in_RDI);
      bVar1 = IsDiagonal(in_stack_fffffffffffffc08,(double)in_stack_fffffffffffffc00);
      if (bVar1) {
        for (local_ec = 0; local_ec < 3; local_ec = local_ec + 1) {
          for (local_f0 = 0; local_f0 < 3; local_f0 = local_f0 + 1) {
            this_00 = (TPZTensor<double> *)
                      TPZVec<double>::operator[]((TPZVec<double> *)(in_RSI + 0xe),(ulong)local_ec);
            operator()(this_00,(int64_t)in_stack_fffffffffffffc00,
                       CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
            bVar1 = AreEqual((TPZTensor<double> *)CONCAT44(iVar6,in_stack_fffffffffffffc10),
                             (double *)this_00,(double *)in_stack_fffffffffffffc00,
                             (double)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
            if (bVar1) {
              pTVar2 = TPZVec<TPZManVector<double,_3>_>::operator[]
                                 ((TPZVec<TPZManVector<double,_3>_> *)(in_RSI + 0x1c),
                                  (ulong)local_ec);
              pdVar3 = TPZVec<double>::operator[](&pTVar2->super_TPZVec<double>,(ulong)local_f0);
              *pdVar3 = 1.0;
              break;
            }
          }
          if (local_f0 == 3) {
            pzinternal::DebugStopImpl(in_stack_00000020,in_stack_00000018);
          }
        }
      }
      else {
        TPZDecomposed::TPZDecomposed(in_RDI,pTVar5);
        TPZTensor((TPZTensor<double> *)CONCAT44(iVar6,in_stack_fffffffffffffc10));
        Precondition(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
                     in_stack_fffffffffffffc78);
        ComputeEigenvectorsInternal(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
        TPZManVector<TPZManVector<double,_3>,_3>::operator=
                  (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
        ~TPZTensor((TPZTensor<double> *)0x14a9705);
        TPZDecomposed::~TPZDecomposed(in_stack_fffffffffffffc00);
      }
    }
    else {
      pzinternal::DebugStopImpl(in_stack_00000020,in_stack_00000018);
    }
  }
  for (local_3b4 = 0; local_3b4 < 3; local_3b4 = local_3b4 + 1) {
    local_3c0 = 0.0;
    for (local_3c4 = 0; local_3c4 < 3; local_3c4 = local_3c4 + 1) {
      pTVar2 = TPZVec<TPZManVector<double,_3>_>::operator[]
                         ((TPZVec<TPZManVector<double,_3>_> *)(in_RSI + 0x1c),(ulong)local_3b4);
      pdVar3 = TPZVec<double>::operator[](&pTVar2->super_TPZVec<double>,(ulong)local_3c4);
      TPZExtractVal::val(*pdVar3);
      _Var4 = std::pow<double,int>((double)in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc);
      local_3c0 = _Var4 + local_3c0;
    }
    pTVar5 = (TPZDecomposed *)sqrt(local_3c0);
    for (local_3c8 = 0; local_3c8 < 3; local_3c8 = local_3c8 + 1) {
      in_stack_fffffffffffffc00 = pTVar5;
      pTVar2 = TPZVec<TPZManVector<double,_3>_>::operator[]
                         ((TPZVec<TPZManVector<double,_3>_> *)(in_RSI + 0x1c),(ulong)local_3b4);
      pdVar3 = TPZVec<double>::operator[](&pTVar2->super_TPZVec<double>,(ulong)local_3c8);
      *pdVar3 = *pdVar3 / (double)in_stack_fffffffffffffc00;
    }
  }
  return;
}

Assistant:

void TPZTensor<T>::ComputeEigenvectors(TPZDecomposed &eigensystem) const {
    // Eigenvalues not computed yet. Let's do it.
    if (eigensystem.fDistinctEigenvalues == 0) {
        ComputeEigenvalues(eigensystem, true);
    } else {
        eigensystem.fEigenvectors[0] = TPZManVector<T, 3>(3, 0.);
        eigensystem.fEigenvectors[1] = TPZManVector<T, 3>(3, 0.);
        eigensystem.fEigenvectors[2] = TPZManVector<T, 3>(3, 0.);
        switch (eigensystem.fDistinctEigenvalues) {
            case 1:
                eigensystem.fEigenvectors[0][0] = 1.;
                eigensystem.fEigenvectors[1][1] = 1.;
                eigensystem.fEigenvectors[2][2] = 1.;
                return;
            case 2:
            case 3:
            {
                T tol = Norm()*1.e-12;
                if (IsDiagonal(tol)) {
                    for (unsigned int i = 0; i < 3; ++i) {
                        unsigned int j;
                        for (j = 0; j < 3; ++j) {
                            if (AreEqual(eigensystem.fEigenvalues[i], this->operator()(j, j), tol)) {
                                eigensystem.fEigenvectors[i][j] = 1;
                                break;
                            }
                        }
                        if (j == 3) {
                            DebugStop();
                        }
                    }
                } else {
                    REAL conditionFactor;
                    TPZDecomposed eigensystemTemp = eigensystem;
                    TPZTensor<T> A;
                    Precondition(conditionFactor, A, eigensystemTemp);
                    A.ComputeEigenvectorsInternal(eigensystemTemp);
                    eigensystem.fEigenvectors = eigensystemTemp.fEigenvectors;
                }
                break;
            }
            default:
                DebugStop();
        }
    }


    for (unsigned int lambda = 0; lambda < 3; ++lambda) {
        REAL Norm = 0.;
        for (unsigned int i = 0; i < 3; ++i) {
            Norm += pow(TPZExtractVal::val(eigensystem.fEigenvectors[lambda][i]), 2);
        }
        Norm = sqrt(Norm);
        for (unsigned int i = 0; i < 3; ++i) {
            eigensystem.fEigenvectors[lambda][i] /= Norm;
        }
    }
}